

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_start(SASL *sasl,connectdata *conn,_Bool force_ir,saslprogress *progress)

{
  size_t sVar1;
  saslstate local_74;
  saslstate local_60;
  saslstate local_5c;
  saslstate state2;
  saslstate state1;
  size_t len;
  char *resp;
  char *mech;
  SessionHandle *pSStack_38;
  uint enabledmechs;
  SessionHandle *data;
  saslprogress *psStack_28;
  CURLcode result;
  saslprogress *progress_local;
  connectdata *pcStack_18;
  _Bool force_ir_local;
  connectdata *conn_local;
  SASL *sasl_local;
  
  data._4_4_ = CURLE_OK;
  pSStack_38 = conn->data;
  resp = (char *)0x0;
  len = 0;
  _state2 = 0;
  local_5c = SASL_STOP;
  local_60 = SASL_FINAL;
  sasl->force_ir = force_ir;
  sasl->authused = 0;
  mech._4_4_ = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;
  psStack_28 = progress;
  progress_local._7_1_ = force_ir;
  pcStack_18 = conn;
  conn_local = (connectdata *)sasl;
  if (((mech._4_4_ & 0x20) == 0) || (*conn->passwd != '\0')) {
    if (((conn->bits).user_passwd & 1U) != 0) {
      if ((mech._4_4_ & 8) == 0) {
        if ((mech._4_4_ & 4) == 0) {
          if (((mech._4_4_ & 0x80) == 0) && (conn->xoauth2_bearer == (char *)0x0)) {
            if ((mech._4_4_ & 1) == 0) {
              if ((mech._4_4_ & 2) != 0) {
                resp = "PLAIN";
                local_5c = SASL_PLAIN;
                sasl->authused = 2;
                if ((force_ir) || (((pSStack_38->set).sasl_ir & 1U) != 0)) {
                  data._4_4_ = sasl_create_plain_message
                                         (pSStack_38,conn->user,conn->passwd,(char **)&len,
                                          (size_t *)&state2);
                }
              }
            }
            else {
              resp = "LOGIN";
              local_5c = SASL_LOGIN;
              local_60 = SASL_LOGIN_PASSWD;
              sasl->authused = 1;
              if ((force_ir) || (((pSStack_38->set).sasl_ir & 1U) != 0)) {
                data._4_4_ = sasl_create_login_message
                                       (pSStack_38,conn->user,(char **)&len,(size_t *)&state2);
              }
            }
          }
          else {
            resp = "XOAUTH2";
            local_5c = SASL_XOAUTH2;
            sasl->authused = 0x80;
            if ((force_ir) || (((pSStack_38->set).sasl_ir & 1U) != 0)) {
              data._4_4_ = sasl_create_xoauth2_message
                                     (pSStack_38,conn->user,conn->xoauth2_bearer,(char **)&len,
                                      (size_t *)&state2);
            }
          }
        }
        else {
          resp = "CRAM-MD5";
          local_5c = SASL_CRAMMD5;
          sasl->authused = 4;
        }
      }
      else {
        resp = "DIGEST-MD5";
        local_5c = SASL_DIGESTMD5;
        sasl->authused = 8;
      }
    }
  }
  else {
    resp = "EXTERNAL";
    local_5c = SASL_EXTERNAL;
    sasl->authused = 0x20;
    if ((force_ir) || (((pSStack_38->set).sasl_ir & 1U) != 0)) {
      data._4_4_ = sasl_create_external_message
                             (pSStack_38,conn->user,(char **)&len,(size_t *)&state2);
    }
  }
  if (data._4_4_ == CURLE_OK) {
    if (((len != 0) && (conn_local->data->easy_conn != (connectdata *)0x0)) &&
       (sVar1 = strlen(resp), conn_local->data->easy_conn < (connectdata *)(sVar1 + _state2))) {
      (*Curl_cfree)((void *)len);
      len = 0;
    }
    if ((resp != (char *)0x0) &&
       (data._4_4_ = (**(code **)&conn_local->data->mstate)(pcStack_18,resp,len),
       data._4_4_ == CURLE_OK)) {
      *psStack_28 = SASL_INPROGRESS;
      if (len == 0) {
        local_74 = local_5c;
      }
      else {
        local_74 = local_60;
      }
      state((SASL *)conn_local,pcStack_18,local_74);
    }
  }
  (*Curl_cfree)((void *)len);
  return data._4_4_;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct connectdata *conn,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  unsigned int enabledmechs;
  const char *mech = NULL;
  char *resp = NULL;
  size_t len = 0;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;

  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      result = sasl_create_external_message(data, conn->user, &resp, &len);
  }
  else if(conn->bits.user_passwd) {
#if defined(USE_KERBEROS5)
    if(enabledmechs & SASL_MECH_GSSAPI) {
      sasl->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      sasl->params->service,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp, &len);
    }
    else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(enabledmechs & SASL_MECH_DIGEST_MD5) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if(enabledmechs & SASL_MECH_NTLM) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                     &conn->ntlm, &resp, &len);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_XOAUTH2) || conn->xoauth2_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_XOAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_xoauth2_message(data, conn->user,
                                             conn->xoauth2_bearer,
                                             &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_login_message(data, conn->user, &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_plain_message(data, conn->user, conn->passwd,
                                           &resp, &len);
    }
  }

  if(!result) {
    if(resp && sasl->params->maxirlen &&
       strlen(mech) + len > sasl->params->maxirlen) {
      free(resp);
      resp = NULL;
    }

    if(mech) {
      result = sasl->params->sendauth(conn, mech, resp);
      if(!result) {
        *progress = SASL_INPROGRESS;
        state(sasl, conn, resp? state2: state1);
      }
    }
  }

  free(resp);

  return result;
}